

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void parasail_sequences_free(parasail_sequences_t *sequences)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < sequences->l; uVar2 = uVar2 + 1) {
    free(*(void **)((long)&(sequences->seqs->name).s + lVar1));
    free(*(void **)((long)&(sequences->seqs->comment).s + lVar1));
    free(*(void **)((long)&(sequences->seqs->seq).s + lVar1));
    free(*(void **)((long)&(sequences->seqs->qual).s + lVar1));
    lVar1 = lVar1 + 0x40;
  }
  free(sequences->seqs);
  free(sequences);
  return;
}

Assistant:

void parasail_sequences_free(parasail_sequences_t *sequences)
{
    size_t i;
    for (i=0; i<sequences->l; ++i) {
        if (sequences->seqs[i].name.s)    free(sequences->seqs[i].name.s);
        if (sequences->seqs[i].comment.s) free(sequences->seqs[i].comment.s);
        if (sequences->seqs[i].seq.s)     free(sequences->seqs[i].seq.s);
        if (sequences->seqs[i].qual.s)    free(sequences->seqs[i].qual.s);
    }
    free(sequences->seqs);
    free(sequences);
}